

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

int __thiscall CEditorMap::Load(CEditorMap *this,IStorage *pStorage,char *pFileName,int StorageType)

{
  uchar uVar1;
  int iVar2;
  CEditor *pCVar3;
  IGraphics *pIVar4;
  undefined8 uVar5;
  CEnvPoint *pCVar6;
  undefined8 uVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  int *piVar11;
  char *pcVar12;
  CLayerGroup *this_00;
  void *pvVar13;
  CLayerTiles *this_01;
  void *pvVar14;
  CTile *pCVar15;
  CEnvelope *pCVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int *piVar22;
  CEnvPoint *pCVar23;
  uint uVar24;
  int iVar25;
  long lVar26;
  long in_FS_OFFSET;
  byte bVar27;
  CEditorImage *pImg;
  int Num;
  int Start;
  CDataFileReader DataFile;
  CEditorImage ImgInfo;
  char aBuf [512];
  CEditorImage *local_400;
  int local_3f8;
  int local_3f4;
  CDataFileReader local_3f0;
  CEditorImage local_3e8;
  CEnvelope *local_238 [64];
  long local_38;
  
  bVar27 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3f0.m_pDataFile = (CDatafile *)0x0;
  bVar9 = CDataFileReader::Open(&local_3f0,pStorage,pFileName,StorageType);
  iVar25 = 0;
  if (bVar9) {
    Clean(this);
    iVar25 = 0;
    piVar11 = (int *)CDataFileReader::FindItem(&local_3f0,0,0);
    if ((piVar11 != (int *)0x0) && (*piVar11 == 1)) {
      piVar11 = (int *)CDataFileReader::FindItem(&local_3f0,1,0);
      if ((piVar11 != (int *)0x0) && (*piVar11 == 1)) {
        if (-1 < piVar11[1]) {
          pcVar12 = (char *)CDataFileReader::GetData(&local_3f0,piVar11[1]);
          str_copy((this->m_MapInfo).m_aAuthor,pcVar12,0x20);
        }
        if (-1 < piVar11[2]) {
          pcVar12 = (char *)CDataFileReader::GetData(&local_3f0,piVar11[2]);
          str_copy((this->m_MapInfo).m_aVersion,pcVar12,0x10);
        }
        if (-1 < piVar11[3]) {
          pcVar12 = (char *)CDataFileReader::GetData(&local_3f0,piVar11[3]);
          str_copy((this->m_MapInfo).m_aCredits,pcVar12,0x80);
        }
        if (-1 < piVar11[4]) {
          pcVar12 = (char *)CDataFileReader::GetData(&local_3f0,piVar11[4]);
          str_copy((this->m_MapInfo).m_aLicense,pcVar12,0x20);
        }
      }
      CDataFileReader::GetType(&local_3f0,2,&local_3f4,&local_3f8);
      if (0 < local_3f8) {
        iVar25 = 0;
        do {
          piVar11 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,local_3f4 + iVar25,(int *)0x0,(int *)0x0);
          pcVar12 = (char *)CDataFileReader::GetData(&local_3f0,piVar11[4]);
          local_400 = (CEditorImage *)operator_new(0x1b0);
          pCVar3 = this->m_pEditor;
          local_400->m_Texture = -1;
          local_400->m_External = 0;
          local_400->m_pEditor = pCVar3;
          local_400->m_aName[0] = '\0';
          (local_400->super_CImageInfo).m_Width = 0;
          (local_400->super_CImageInfo).m_Height = 0;
          (local_400->super_CImageInfo).m_pData = (void *)0x0;
          (local_400->super_CImageInfo).m_Format = 0;
          local_400->m_pAutoMapper = (IAutoMapper *)0x0;
          iVar10 = piVar11[3];
          local_400->m_External = iVar10;
          if ((iVar10 == 0) && ((iVar10 = *piVar11, iVar10 < 2 || ((uint)piVar11[6] < 2)))) {
            iVar2 = piVar11[1];
            (local_400->super_CImageInfo).m_Width = iVar2;
            iVar17 = piVar11[2];
            (local_400->super_CImageInfo).m_Height = iVar17;
            uVar18 = 1;
            if (iVar10 != 1) {
              uVar18 = piVar11[6];
            }
            (local_400->super_CImageInfo).m_Format = uVar18;
            iVar10 = 0;
            if (uVar18 < 3) {
              iVar10 = *(int *)(&DAT_001e0bfc + (ulong)uVar18 * 4);
            }
            pvVar13 = CDataFileReader::GetData(&local_3f0,piVar11[5]);
            uVar18 = iVar17 * iVar2 * iVar10;
            pvVar14 = mem_alloc(uVar18);
            (local_400->super_CImageInfo).m_pData = pvVar14;
            mem_copy(pvVar14,pvVar13,uVar18);
            pIVar4 = this->m_pEditor->m_pGraphics;
            iVar10 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
                               (pIVar4,(ulong)(uint)(local_400->super_CImageInfo).m_Width,
                                (ulong)(uint)(local_400->super_CImageInfo).m_Height,
                                (ulong)(uint)(local_400->super_CImageInfo).m_Format,
                                (local_400->super_CImageInfo).m_pData,0xffffffff,8);
            (local_400->m_Texture).m_Id = iVar10;
          }
          else {
            str_format((char *)local_238,0x200,"mapres/%s.png",pcVar12);
            local_3e8.m_pEditor = this->m_pEditor;
            local_3e8.m_Texture.m_Id = -1;
            local_3e8.m_External = 0;
            local_3e8.m_aName[0] = '\0';
            local_3e8.super_CImageInfo.m_Width = 0;
            local_3e8.super_CImageInfo.m_Height = 0;
            local_3e8.super_CImageInfo.m_pData = (void *)0x0;
            local_3e8.super_CImageInfo.m_Format = 0;
            local_3e8.m_pAutoMapper = (IAutoMapper *)0x0;
            iVar10 = (*((local_3e8.m_pEditor)->m_pGraphics->super_IInterface)._vptr_IInterface[0xe])
                               ((local_3e8.m_pEditor)->m_pGraphics,&local_3e8,local_238);
            if (iVar10 != 0) {
              memcpy(local_400,&local_3e8,0x1b0);
              pIVar4 = this->m_pEditor->m_pGraphics;
              iVar10 = (*(pIVar4->super_IInterface)._vptr_IInterface[0x10])
                                 (pIVar4,local_3e8.super_CImageInfo._0_8_ & 0xffffffff,
                                  (ulong)local_3e8.super_CImageInfo._0_8_ >> 0x20,
                                  (ulong)(uint)local_3e8.super_CImageInfo.m_Format,
                                  local_3e8.super_CImageInfo.m_pData,0xffffffff,8);
              (local_400->m_Texture).m_Id = iVar10;
              local_3e8.super_CImageInfo.m_pData = (void *)0x0;
              local_400->m_External = 1;
            }
            CEditorImage::~CEditorImage(&local_3e8);
          }
          if (pcVar12 != (char *)0x0) {
            str_copy(local_400->m_aName,pcVar12,0x80);
          }
          CEditorImage::LoadAutoMapper(local_400);
          array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::add
                    (&this->m_lImages,&local_400);
          CDataFileReader::UnloadData(&local_3f0,piVar11[5]);
          CDataFileReader::UnloadData(&local_3f0,piVar11[4]);
          iVar25 = iVar25 + 1;
        } while (iVar25 < local_3f8);
      }
      CDataFileReader::GetType(&local_3f0,5,(int *)local_238,(int *)&local_3e8);
      CDataFileReader::GetType(&local_3f0,4,(int *)&local_400,&local_3f4);
      if (0 < local_3f4) {
        iVar25 = 0;
        do {
          piVar11 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,(int)local_400 + iVar25,(int *)0x0,(int *)0x0);
          if (0xfffffffc < *piVar11 - 4U) {
            this_00 = NewGroup(this);
            iVar10 = piVar11[2];
            iVar2 = piVar11[3];
            iVar17 = piVar11[4];
            this_00->m_OffsetX = piVar11[1];
            this_00->m_OffsetY = iVar10;
            this_00->m_ParallaxX = iVar2;
            this_00->m_ParallaxY = iVar17;
            iVar10 = *piVar11;
            if (1 < iVar10) {
              iVar2 = piVar11[8];
              iVar17 = piVar11[9];
              iVar8 = piVar11[10];
              this_00->m_UseClipping = piVar11[7];
              this_00->m_ClipX = iVar2;
              this_00->m_ClipY = iVar17;
              this_00->m_ClipW = iVar8;
              this_00->m_ClipH = piVar11[0xb];
            }
            if (2 < iVar10) {
              lVar21 = 0;
              do {
                lVar26 = lVar21;
                this_00->m_aName[lVar26 * 4] = *(char *)((long)piVar11 + lVar26 * 4 + 0x33) + -0x80;
                this_00->m_aName[lVar26 * 4 + 1] =
                     *(char *)((long)piVar11 + lVar26 * 4 + 0x32) + -0x80;
                this_00->m_aName[lVar26 * 4 + 2] =
                     *(char *)((long)piVar11 + lVar26 * 4 + 0x31) + -0x80;
                this_00->m_aName[lVar26 * 4 + 3] = (char)piVar11[lVar26 + 0xc] + -0x80;
                lVar21 = lVar26 + 1;
              } while ((int)(lVar26 + 1) != 3);
              this_00->m_aName[lVar26 * 4 + 3] = '\0';
            }
            if (0 < piVar11[6]) {
              iVar10 = 0;
              do {
                pvVar13 = CDataFileReader::GetItem
                                    (&local_3f0,(int)local_238[0] + iVar10 + piVar11[5],(int *)0x0,
                                     (int *)0x0);
                if (pvVar13 != (void *)0x0) {
                  if (*(int *)((long)pvVar13 + 4) == 3) {
                    this_01 = (CLayerTiles *)operator_new(0x40);
                    CLayerQuads::CLayerQuads((CLayerQuads *)this_01);
                    (this_01->super_CLayer).m_pEditor = this->m_pEditor;
                    iVar2 = *(int *)((long)pvVar13 + 0x18);
                    (this_01->m_Texture).m_Id = iVar2;
                    iVar17 = -1;
                    if (iVar2 < (this->m_lImages).num_elements) {
                      iVar17 = iVar2;
                    }
                    if (iVar2 < -1) {
                      iVar17 = -1;
                    }
                    (this_01->m_Texture).m_Id = iVar17;
                    if (1 < *(int *)((long)pvVar13 + 0xc)) {
                      lVar21 = 0;
                      do {
                        lVar26 = lVar21;
                        (this_01->super_CLayer).m_aName[lVar26 * 4] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x1f) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 1] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x1e) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 2] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x1d) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 3] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x1c) + -0x80;
                        lVar21 = lVar26 + 1;
                      } while ((int)(lVar26 + 1) != 3);
                      (this_01->super_CLayer).m_aName[lVar26 * 4 + 3] = '\0';
                    }
                    pvVar14 = CDataFileReader::GetDataSwapped
                                        (&local_3f0,*(int *)((long)pvVar13 + 0x14));
                    CLayerGroup::AddLayer(this_00,(CLayer *)this_01);
                    iVar2 = *(int *)((long)pvVar13 + 0x10);
                    if (this_01->m_Height < iVar2) {
                      array<CQuad,_allocator_default<CQuad>_>::alloc
                                ((array<CQuad,_allocator_default<CQuad>_> *)&this_01->m_Image,iVar2)
                      ;
                    }
                    (this_01->m_Color).r = iVar2;
                    mem_copy(((array<CQuad,_allocator_default<CQuad>_> *)&this_01->m_Image)->list,
                             pvVar14,*(int *)((long)pvVar13 + 0x10) * 0x98);
                    CDataFileReader::UnloadData(&local_3f0,*(int *)((long)pvVar13 + 0x14));
                  }
                  else if (*(int *)((long)pvVar13 + 4) == 2) {
                    if ((*(byte *)((long)pvVar13 + 0x18) & 1) == 0) {
                      this_01 = (CLayerTiles *)operator_new(0x80);
                      CLayerTiles::CLayerTiles
                                (this_01,*(int *)((long)pvVar13 + 0x10),
                                 *(int *)((long)pvVar13 + 0x14));
                      (this_01->super_CLayer).m_pEditor = this->m_pEditor;
                      uVar5 = *(undefined8 *)((long)pvVar13 + 0x1c);
                      uVar7 = *(undefined8 *)((long)pvVar13 + 0x24);
                      (this_01->m_Color).r = (int)uVar5;
                      (this_01->m_Color).g = (int)((ulong)uVar5 >> 0x20);
                      (this_01->m_Color).b = (int)uVar7;
                      (this_01->m_Color).a = (int)((ulong)uVar7 >> 0x20);
                      uVar5 = *(undefined8 *)((long)pvVar13 + 0x2c);
                      this_01->m_ColorEnv = (int)uVar5;
                      this_01->m_ColorEnvOffset = (int)((ulong)uVar5 >> 0x20);
                    }
                    else {
                      this_01 = (CLayerTiles *)operator_new(0x80);
                      CLayerGame::CLayerGame
                                ((CLayerGame *)this_01,*(int *)((long)pvVar13 + 0x10),
                                 *(int *)((long)pvVar13 + 0x14));
                      MakeGameLayer(this,(CLayer *)this_01);
                      MakeGameGroup(this,this_00);
                    }
                    CLayerGroup::AddLayer(this_00,&this_01->super_CLayer);
                    pCVar15 = (CTile *)CDataFileReader::GetData
                                                 (&local_3f0,*(int *)((long)pvVar13 + 0x38));
                    this_01->m_Image = *(int *)((long)pvVar13 + 0x34);
                    this_01->m_Game = *(uint *)((long)pvVar13 + 0x18) & 1;
                    if (2 < *(int *)((long)pvVar13 + 0xc)) {
                      lVar21 = 0;
                      do {
                        lVar26 = lVar21;
                        (this_01->super_CLayer).m_aName[lVar26 * 4] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x3f) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 1] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x3e) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 2] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x3d) + -0x80;
                        (this_01->super_CLayer).m_aName[lVar26 * 4 + 3] =
                             *(char *)((long)pvVar13 + lVar26 * 4 + 0x3c) + -0x80;
                        lVar21 = lVar26 + 1;
                      } while ((int)(lVar26 + 1) != 3);
                      (this_01->super_CLayer).m_aName[lVar26 * 4 + 3] = '\0';
                    }
                    if (*(int *)((long)pvVar13 + 0xc) < 4) {
                      mem_copy(this_01->m_pTiles,pCVar15,this_01->m_Width * this_01->m_Height * 4);
                    }
                    else {
                      CLayerTiles::ExtractTiles(this_01,pCVar15);
                    }
                    if (((this_01->m_Game != 0) && (*(int *)((long)pvVar13 + 0xc) == 0x10048)) &&
                       (uVar18 = this_01->m_Height * this_01->m_Width, 0 < (int)uVar18)) {
                      pCVar15 = this_01->m_pTiles;
                      uVar20 = 0;
                      do {
                        uVar1 = pCVar15[uVar20].m_Index;
                        if (uVar1 != '\0') {
                          pCVar15[uVar20].m_Index = uVar1 + 0xbf;
                        }
                        uVar20 = uVar20 + 1;
                      } while (uVar18 != uVar20);
                    }
                    CDataFileReader::UnloadData(&local_3f0,*(int *)((long)pvVar13 + 0x38));
                  }
                  else {
                    this_01 = (CLayerTiles *)0x0;
                  }
                  if (this_01 != (CLayerTiles *)0x0) {
                    (this_01->super_CLayer).m_Flags = *(int *)((long)pvVar13 + 8);
                  }
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < piVar11[6]);
            }
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < local_3f4);
      }
      CDataFileReader::GetType(&local_3f0,6,(int *)local_238,(int *)&local_3e8);
      if (local_3e8.super_CImageInfo.m_Width == 0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = CDataFileReader::GetItem(&local_3f0,(int)local_238[0],(int *)0x0,(int *)0x0);
      }
      CDataFileReader::GetType(&local_3f0,3,(int *)&local_3e8,(int *)&local_400);
      if (0 < (int)local_400) {
        iVar25 = 0;
        do {
          piVar11 = (int *)CDataFileReader::GetItem
                                     (&local_3f0,local_3e8.super_CImageInfo.m_Width + iVar25,
                                      (int *)0x0,(int *)0x0);
          uVar18 = piVar11[1];
          uVar24 = 4;
          if ((int)uVar18 < 4) {
            uVar24 = uVar18;
          }
          pCVar16 = (CEnvelope *)operator_new(0x48);
          (pCVar16->m_lPoints).list = (CEnvPoint *)0x0;
          array<CEnvPoint,_allocator_default<CEnvPoint>_>::clear(&pCVar16->m_lPoints);
          pCVar16->m_Channels = uVar24;
          pCVar16->m_aName[0] = '\0';
          pCVar16->m_Bottom = 0.0;
          pCVar16->m_Top = 0.0;
          pCVar16->m_Synchronized = true;
          iVar10 = piVar11[3];
          local_238[0] = pCVar16;
          if ((pCVar16->m_lPoints).list_size < iVar10) {
            array<CEnvPoint,_allocator_default<CEnvPoint>_>::alloc(&pCVar16->m_lPoints,iVar10);
          }
          (pCVar16->m_lPoints).num_elements = iVar10;
          if (0 < piVar11[3]) {
            lVar26 = 8;
            lVar21 = 0;
            do {
              pCVar23 = (local_238[0]->m_lPoints).list + lVar21;
              if (*piVar11 < 3) {
                iVar10 = piVar11[2];
                mem_zero(pCVar23,0x58);
                lVar19 = (long)(iVar10 + (int)lVar21);
                pCVar6 = (local_238[0]->m_lPoints).list;
                uVar5 = *(undefined8 *)(lVar19 * 0x18 + (long)pvVar13);
                pCVar23 = pCVar6 + lVar21;
                (pCVar23->super_CEnvPoint_v1).m_Time = (int)uVar5;
                (pCVar23->super_CEnvPoint_v1).m_Curvetype = (int)((ulong)uVar5 >> 0x20);
                if (0 < (int)uVar18) {
                  uVar20 = 0;
                  do {
                    *(undefined4 *)
                     ((long)(pCVar6->super_CEnvPoint_v1).m_aValues + uVar20 * 4 + lVar26 + -8) =
                         *(undefined4 *)((long)pvVar13 + uVar20 * 4 + lVar19 * 0x18 + 8);
                    uVar20 = uVar20 + 1;
                  } while (uVar24 != uVar20);
                }
              }
              else {
                piVar22 = (int *)(((long)(int)lVar21 + (long)piVar11[2]) * 0x58 + (long)pvVar13);
                for (lVar19 = 0x16; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pCVar23->super_CEnvPoint_v1).m_Time = *piVar22;
                  piVar22 = piVar22 + (ulong)bVar27 * -2 + 1;
                  pCVar23 = (CEnvPoint *)((long)pCVar23 + ((ulong)bVar27 * -2 + 1) * 4);
                }
              }
              lVar21 = lVar21 + 1;
              lVar26 = lVar26 + 0x58;
            } while (lVar21 < piVar11[3]);
          }
          if (piVar11[4] != -1) {
            lVar21 = 0;
            do {
              lVar26 = lVar21;
              local_238[0]->m_aName[lVar26 * 4] =
                   *(char *)((long)piVar11 + lVar26 * 4 + 0x13) + -0x80;
              local_238[0]->m_aName[lVar26 * 4 + 1] =
                   *(char *)((long)piVar11 + lVar26 * 4 + 0x12) + -0x80;
              local_238[0]->m_aName[lVar26 * 4 + 2] =
                   *(char *)((long)piVar11 + lVar26 * 4 + 0x11) + -0x80;
              local_238[0]->m_aName[lVar26 * 4 + 3] = (char)piVar11[lVar26 + 4] + -0x80;
              lVar21 = lVar26 + 1;
            } while ((int)(lVar26 + 1) != 8);
            local_238[0]->m_aName[lVar26 * 4 + 3] = '\0';
          }
          array<CEnvelope_*,_allocator_default<CEnvelope_*>_>::add(&this->m_lEnvelopes,local_238);
          if (1 < *piVar11) {
            local_238[0]->m_Synchronized = piVar11[0xc] != 0;
          }
          iVar25 = iVar25 + 1;
        } while (iVar25 < (int)local_400);
      }
      iVar25 = 1;
    }
  }
  CDataFileReader::Close(&local_3f0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar25;
}

Assistant:

int CEditorMap::Load(class IStorage *pStorage, const char *pFileName, int StorageType)
{
	CDataFileReader DataFile;
	if(!DataFile.Open(pStorage, pFileName, StorageType))
		return 0;

	Clean();

	// check version
	CMapItemVersion *pItem = (CMapItemVersion *)DataFile.FindItem(MAPITEMTYPE_VERSION, 0);
	if(!pItem)
	{
		return 0;
	}
	else if(pItem->m_Version == CMapItemVersion::CURRENT_VERSION)
	{
		// load map info
		{
			CMapItemInfo *pItem = (CMapItemInfo *)DataFile.FindItem(MAPITEMTYPE_INFO, 0);
			if(pItem && pItem->m_Version == 1)
			{
				if(pItem->m_Author > -1)
					str_copy(m_MapInfo.m_aAuthor, (char *)DataFile.GetData(pItem->m_Author), sizeof(m_MapInfo.m_aAuthor));
				if(pItem->m_MapVersion > -1)
					str_copy(m_MapInfo.m_aVersion, (char *)DataFile.GetData(pItem->m_MapVersion), sizeof(m_MapInfo.m_aVersion));
				if(pItem->m_Credits > -1)
					str_copy(m_MapInfo.m_aCredits, (char *)DataFile.GetData(pItem->m_Credits), sizeof(m_MapInfo.m_aCredits));
				if(pItem->m_License > -1)
					str_copy(m_MapInfo.m_aLicense, (char *)DataFile.GetData(pItem->m_License), sizeof(m_MapInfo.m_aLicense));
			}
		}

		// load images
		{
			int Start, Num;
			DataFile.GetType( MAPITEMTYPE_IMAGE, &Start, &Num);
			for(int i = 0; i < Num; i++)
			{
				CMapItemImage *pItem = (CMapItemImage *)DataFile.GetItem(Start+i, 0, 0);
				char *pName = (char *)DataFile.GetData(pItem->m_ImageName);

				// copy base info
				CEditorImage *pImg = new CEditorImage(m_pEditor);
				pImg->m_External = pItem->m_External;

				if(pItem->m_External || (pItem->m_Version > 1 && pItem->m_Format != CImageInfo::FORMAT_RGB && pItem->m_Format != CImageInfo::FORMAT_RGBA))
				{
					char aBuf[IO_MAX_PATH_LENGTH];
					str_format(aBuf, sizeof(aBuf),"mapres/%s.png", pName);

					// load external
					CEditorImage ImgInfo(m_pEditor);
					if(m_pEditor->Graphics()->LoadPNG(&ImgInfo, aBuf, IStorage::TYPE_ALL))
					{
						*pImg = ImgInfo;
						pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(ImgInfo.m_Width, ImgInfo.m_Height, ImgInfo.m_Format, ImgInfo.m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
						ImgInfo.m_pData = 0;
						pImg->m_External = 1;
					}
				}
				else
				{
					pImg->m_Width = pItem->m_Width;
					pImg->m_Height = pItem->m_Height;
					pImg->m_Format = pItem->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pItem->m_Format;

					// copy image data
					const int DataSize = pImg->m_Width * pImg->m_Height * pImg->GetPixelSize();
					void *pData = DataFile.GetData(pItem->m_ImageData);
					pImg->m_pData = mem_alloc(DataSize);
					mem_copy(pImg->m_pData, pData, DataSize);
					pImg->m_Texture = m_pEditor->Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Format, pImg->m_pData, CImageInfo::FORMAT_AUTO, IGraphics::TEXLOAD_MULTI_DIMENSION);
				}

				// copy image name
				if(pName)
					str_copy(pImg->m_aName, pName, 128);

				// load auto mapper file
				pImg->LoadAutoMapper();

				m_lImages.add(pImg);

				// unload image
				DataFile.UnloadData(pItem->m_ImageData);
				DataFile.UnloadData(pItem->m_ImageName);
			}
		}

		// load groups
		{
			int LayersStart, LayersNum;
			DataFile.GetType(MAPITEMTYPE_LAYER, &LayersStart, &LayersNum);

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_GROUP, &Start, &Num);
			for(int g = 0; g < Num; g++)
			{
				CMapItemGroup *pGItem = (CMapItemGroup *)DataFile.GetItem(Start+g, 0, 0);

				if(pGItem->m_Version < 1 || pGItem->m_Version > CMapItemGroup::CURRENT_VERSION)
					continue;

				CLayerGroup *pGroup = NewGroup();
				pGroup->m_ParallaxX = pGItem->m_ParallaxX;
				pGroup->m_ParallaxY = pGItem->m_ParallaxY;
				pGroup->m_OffsetX = pGItem->m_OffsetX;
				pGroup->m_OffsetY = pGItem->m_OffsetY;

				if(pGItem->m_Version >= 2)
				{
					pGroup->m_UseClipping = pGItem->m_UseClipping;
					pGroup->m_ClipX = pGItem->m_ClipX;
					pGroup->m_ClipY = pGItem->m_ClipY;
					pGroup->m_ClipW = pGItem->m_ClipW;
					pGroup->m_ClipH = pGItem->m_ClipH;
				}

				// load group name
				if(pGItem->m_Version >= 3)
					IntsToStr(pGItem->m_aName, sizeof(pGroup->m_aName)/sizeof(int), pGroup->m_aName);

				for(int l = 0; l < pGItem->m_NumLayers; l++)
				{
					CLayer *pLayer = 0;
					CMapItemLayer *pLayerItem = (CMapItemLayer *)DataFile.GetItem(LayersStart+pGItem->m_StartLayer+l, 0, 0);
					if(!pLayerItem)
						continue;

					if(pLayerItem->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTilemapItem = (CMapItemLayerTilemap *)pLayerItem;
						CLayerTiles *pTiles = 0;

						if(pTilemapItem->m_Flags&TILESLAYERFLAG_GAME)
						{
							pTiles = new CLayerGame(pTilemapItem->m_Width, pTilemapItem->m_Height);
							MakeGameLayer(pTiles);
							MakeGameGroup(pGroup);
						}
						else
						{
							pTiles = new CLayerTiles(pTilemapItem->m_Width, pTilemapItem->m_Height);
							pTiles->m_pEditor = m_pEditor;
							pTiles->m_Color = pTilemapItem->m_Color;
							pTiles->m_ColorEnv = pTilemapItem->m_ColorEnv;
							pTiles->m_ColorEnvOffset = pTilemapItem->m_ColorEnvOffset;
						}

						pLayer = pTiles;

						pGroup->AddLayer(pTiles);
						void *pData = DataFile.GetData(pTilemapItem->m_Data);
						pTiles->m_Image = pTilemapItem->m_Image;
						pTiles->m_Game = pTilemapItem->m_Flags&TILESLAYERFLAG_GAME;

						// load layer name
						if(pTilemapItem->m_Version >= 3)
							IntsToStr(pTilemapItem->m_aName, sizeof(pTiles->m_aName)/sizeof(int), pTiles->m_aName);

						// get tile data
						if(pTilemapItem->m_Version > 3)
							pTiles->ExtractTiles((CTile *)pData);
						else
							mem_copy(pTiles->m_pTiles, pData, pTiles->m_Width*pTiles->m_Height*sizeof(CTile));


						if(pTiles->m_Game && pTilemapItem->m_Version == MakeVersion(1, *pTilemapItem))
						{
							for(int i = 0; i < pTiles->m_Width*pTiles->m_Height; i++)
							{
								if(pTiles->m_pTiles[i].m_Index)
									pTiles->m_pTiles[i].m_Index += ENTITY_OFFSET;
							}
						}

						DataFile.UnloadData(pTilemapItem->m_Data);
					}
					else if(pLayerItem->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQuadsItem = (CMapItemLayerQuads *)pLayerItem;
						CLayerQuads *pQuads = new CLayerQuads;
						pQuads->m_pEditor = m_pEditor;
						pLayer = pQuads;
						pQuads->m_Image = pQuadsItem->m_Image;
						if(pQuads->m_Image < -1 || pQuads->m_Image >= m_lImages.size())
							pQuads->m_Image = -1;

						// load layer name
						if(pQuadsItem->m_Version >= 2)
							IntsToStr(pQuadsItem->m_aName, sizeof(pQuads->m_aName)/sizeof(int), pQuads->m_aName);

						void *pData = DataFile.GetDataSwapped(pQuadsItem->m_Data);
						pGroup->AddLayer(pQuads);
						pQuads->m_lQuads.set_size(pQuadsItem->m_NumQuads);
						mem_copy(pQuads->m_lQuads.base_ptr(), pData, sizeof(CQuad)*pQuadsItem->m_NumQuads);
						DataFile.UnloadData(pQuadsItem->m_Data);
					}

					if(pLayer)
						pLayer->m_Flags = pLayerItem->m_Flags;
				}
			}
		}

		// load envelopes
		{
			CEnvPoint *pEnvPoints = 0;
			{
				int Start, Num;
				DataFile.GetType(MAPITEMTYPE_ENVPOINTS, &Start, &Num);
				if(Num)
					pEnvPoints = (CEnvPoint *)DataFile.GetItem(Start, 0, 0);
			}

			int Start, Num;
			DataFile.GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);
			for(int e = 0; e < Num; e++)
			{
				CMapItemEnvelope *pItem = (CMapItemEnvelope *)DataFile.GetItem(Start+e, 0, 0);
				const int Channels = minimum(pItem->m_Channels, 4);
				CEnvelope *pEnv = new CEnvelope(Channels);
				pEnv->m_lPoints.set_size(pItem->m_NumPoints);
				for(int n = 0; n < pItem->m_NumPoints; n++)
				{
					if(pItem->m_Version >= 3)
					{
						pEnv->m_lPoints[n] = pEnvPoints[pItem->m_StartPoint + n];
					}
					else
					{
						// backwards compatibility
						CEnvPoint_v1 *pEnvPoint_v1 = &((CEnvPoint_v1 *)pEnvPoints)[pItem->m_StartPoint + n];
						mem_zero((void*)&pEnv->m_lPoints[n], sizeof(CEnvPoint));

						pEnv->m_lPoints[n].m_Time = pEnvPoint_v1->m_Time;
						pEnv->m_lPoints[n].m_Curvetype = pEnvPoint_v1->m_Curvetype;

						for(int c = 0; c < Channels; c++)
						{
							pEnv->m_lPoints[n].m_aValues[c] = pEnvPoint_v1->m_aValues[c];
						}
					}
				}

				if(pItem->m_aName[0] != -1)	// compatibility with old maps
					IntsToStr(pItem->m_aName, sizeof(pItem->m_aName)/sizeof(int), pEnv->m_aName);
				m_lEnvelopes.add(pEnv);
				if(pItem->m_Version >= 2)
					pEnv->m_Synchronized = pItem->m_Synchronized;
			}
		}
	}
	else
		return 0;

	return 1;
}